

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O3

void __thiscall jpge::jpeg_encoder::emit_sos(jpeg_encoder *this)

{
  char cVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  _func_int **pp_Var5;
  uint8 uVar6;
  uint uVar7;
  undefined1 *puVar8;
  output_stream *poVar9;
  uint uVar10;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  emit_marker(this,0xda);
  emit_word(this,(uint)this->m_num_components * 2 + 6);
  uVar6 = this->m_num_components;
  if (this->m_all_stream_writes_succeeded == true) {
    uVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_37,1);
    uVar6 = this->m_num_components;
  }
  else {
    uVar3 = 0;
  }
  cVar1 = (char)uVar3;
  this->m_all_stream_writes_succeeded = (bool)cVar1;
  if (uVar6 != '\0') {
    uVar10 = 0;
    do {
      uVar7 = uVar10 + 1;
      if ((uVar3 & 1) == 0) {
        cVar1 = false;
      }
      else {
        iVar4 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_33,1);
        cVar1 = (char)iVar4;
      }
      this->m_all_stream_writes_succeeded = (bool)cVar1;
      if (uVar10 == 0) {
        if ((bool)cVar1 == false) goto LAB_0012bacc;
        poVar9 = this->m_pStream;
        pp_Var5 = poVar9->_vptr_output_stream;
        puVar8 = &local_32;
LAB_0012bac2:
        uVar3 = (*pp_Var5[2])(poVar9,puVar8,1);
      }
      else {
        if ((bool)cVar1 != false) {
          poVar9 = this->m_pStream;
          pp_Var5 = poVar9->_vptr_output_stream;
          puVar8 = &local_31;
          goto LAB_0012bac2;
        }
LAB_0012bacc:
        uVar3 = 0;
      }
      cVar1 = (char)uVar3;
      this->m_all_stream_writes_succeeded = (bool)cVar1;
      uVar10 = uVar7;
    } while (uVar7 < this->m_num_components);
  }
  if (cVar1 == '\0') {
    this->m_all_stream_writes_succeeded = false;
  }
  else {
    iVar4 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_36,1);
    this->m_all_stream_writes_succeeded = SUB41(iVar4,0);
    if (SUB41(iVar4,0) != false) {
      iVar4 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_35,1);
      this->m_all_stream_writes_succeeded = SUB41(iVar4,0);
      if (SUB41(iVar4,0) != false) {
        iVar4 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_34,1);
        uVar2 = (undefined1)iVar4;
        goto LAB_0012bb4a;
      }
    }
  }
  uVar2 = false;
LAB_0012bb4a:
  this->m_all_stream_writes_succeeded = (bool)uVar2;
  return;
}

Assistant:

void jpeg_encoder::emit_sos() {
  emit_marker(M_SOS);
  emit_word(2 * m_num_components + 2 + 1 + 3);
  emit_byte(m_num_components);
  for (int i = 0; i < m_num_components; i++) {
    emit_byte(static_cast<uint8>(i + 1));
    if (i == 0)
      emit_byte((0 << 4) + 0);
    else
      emit_byte((1 << 4) + 1);
  }
  emit_byte(0); /* spectral selection */
  emit_byte(63);
  emit_byte(0);
}